

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifTune.c
# Opt level: O2

Gia_Man_t * Ifn_ManStrFindCofactors(int nIns,Gia_Man_t *p)

{
  byte bVar1;
  uint uVar2;
  int iVar3;
  int iLit1;
  Gia_Man_t *p_00;
  char *pcVar4;
  Gia_Obj_t *pGVar5;
  Gia_Man_t *pGVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  
  bVar1 = (byte)nIns & 0x1f;
  uVar7 = 1 << bVar1;
  p_00 = Gia_ManStart(p->nObjs);
  pcVar4 = Abc_UtilStrsav(p->pName);
  p_00->pName = pcVar4;
  Gia_ManHashAlloc(p_00);
  p->pObjs->Value = 0;
  iVar8 = 0;
  while ((iVar8 < p->vCis->nSize && (pGVar5 = Gia_ManCi(p,iVar8), pGVar5 != (Gia_Obj_t *)0x0))) {
    if (nIns <= iVar8) {
      uVar2 = Gia_ManAppendCi(p_00);
      pGVar5->Value = uVar2;
    }
    iVar8 = iVar8 + 1;
  }
  uVar2 = 0;
  if (1 << bVar1 < 1) {
    uVar7 = 0;
  }
  for (; uVar2 != uVar7; uVar2 = uVar2 + 1) {
    uVar9 = 0;
    while (((int)uVar9 < p->vCis->nSize && (pGVar5 = Gia_ManCi(p,uVar9), pGVar5 != (Gia_Obj_t *)0x0)
           )) {
      if ((int)uVar9 < nIns) {
        pGVar5->Value = (uint)((uVar2 >> (uVar9 & 0x1f) & 1) != 0);
      }
      uVar9 = uVar9 + 1;
    }
    iVar8 = 0;
    while ((iVar8 < p->nObjs && (pGVar5 = Gia_ManObj(p,iVar8), pGVar5 != (Gia_Obj_t *)0x0))) {
      if ((~*(uint *)pGVar5 & 0x1fffffff) != 0 && -1 < (int)*(uint *)pGVar5) {
        iVar3 = Gia_ObjFanin0Copy(pGVar5);
        uVar9 = (uint)((ulong)*(undefined8 *)pGVar5 >> 0x20);
        iLit1 = Abc_LitNotCond(pGVar5[-(ulong)(uVar9 & 0x1fffffff)].Value,uVar9 >> 0x1d & 1);
        uVar9 = Gia_ManHashAnd(p_00,iVar3,iLit1);
        pGVar5->Value = uVar9;
      }
      iVar8 = iVar8 + 1;
    }
    iVar8 = 0;
    while ((iVar8 < p->vCos->nSize - p->nRegs &&
           (pGVar5 = Gia_ManCo(p,iVar8), pGVar5 != (Gia_Obj_t *)0x0))) {
      iVar3 = Gia_ObjFanin0Copy(pGVar5);
      uVar9 = Gia_ManAppendCo(p_00,iVar3);
      pGVar5->Value = uVar9;
      iVar8 = iVar8 + 1;
    }
  }
  pGVar6 = Gia_ManCleanup(p_00);
  Gia_ManStop(p_00);
  return pGVar6;
}

Assistant:

Gia_Man_t * Ifn_ManStrFindCofactors( int nIns, Gia_Man_t * p )
{
    Gia_Man_t * pNew, * pTemp; 
    Gia_Obj_t * pObj;
    int i, m, nMints = 1 << nIns;
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    Gia_ManHashAlloc( pNew );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachCi( p, pObj, i )
        if ( i >= nIns )
            pObj->Value = Gia_ManAppendCi( pNew );
    for ( m = 0; m < nMints; m++ )
    {
        Gia_ManForEachCi( p, pObj, i )
            if ( i < nIns )
                pObj->Value = ((m >> i) & 1);
        Gia_ManForEachAnd( p, pObj, i )
            pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
        Gia_ManForEachPo( p, pObj, i )
            pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    }
    pNew = Gia_ManCleanup( pTemp = pNew );
    Gia_ManStop( pTemp );
    return pNew;
}